

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::deleteRows(HighsSparseMatrix *this,HighsIndexCollection *index_collection)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  HighsInt keep_to_row;
  HighsInt delete_from_row;
  HighsInt current_set_entry;
  HighsInt delete_to_row;
  HighsInt to_k;
  HighsInt from_k;
  HighsInt keep_from_row;
  vector<int,_std::allocator<int>_> new_index;
  HighsInt local_64;
  int local_60;
  HighsInt local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  vector<int,_std::allocator<int>_> local_48;
  
  limits(index_collection,&local_50,&local_54);
  if (local_54 < local_50) {
    return;
  }
  iVar8 = this->num_row_;
  local_64 = -1;
  local_5c = 0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)iVar8);
  if (index_collection->is_mask_ == true) {
    if (0 < this->num_row_) {
      piVar1 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = 0;
      iVar9 = 0;
      do {
        if (piVar1[lVar5] == 0) {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] = iVar9;
          iVar9 = iVar9 + 1;
        }
        else {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar5] = -1;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < this->num_row_);
      goto LAB_003819e1;
    }
  }
  else {
    local_64 = -1;
    local_5c = 0;
    if (local_50 <= local_54) {
      iVar9 = 0;
      iVar10 = local_50;
      do {
        updateOutInIndex(index_collection,&local_60,&local_58,&local_4c,&local_64,&local_5c);
        if ((iVar10 == local_50) && (0 < local_60)) {
          lVar5 = 0;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5] = iVar9 + (int)lVar5;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_60);
          iVar9 = iVar9 + (int)lVar5;
        }
        if (local_60 <= local_58) {
          lVar5 = (long)local_60 + -1;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5 + 1] = -1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_58);
        }
        if (local_4c <= local_64) {
          lVar5 = (long)local_4c + -1;
          do {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar5 + 1] = iVar9;
            iVar9 = iVar9 + 1;
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_64);
        }
      } while ((local_64 < iVar8 + -1) && (bVar4 = iVar10 < local_54, iVar10 = iVar10 + 1, bVar4));
      goto LAB_003819e1;
    }
  }
  iVar9 = 0;
LAB_003819e1:
  iVar8 = this->num_col_;
  if (iVar8 < 1) {
    iVar10 = 0;
  }
  else {
    piVar1 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar10 = 0;
    lVar5 = 0;
    do {
      iVar8 = piVar1[lVar5];
      lVar7 = (long)iVar8;
      piVar1[lVar5] = iVar10;
      lVar6 = lVar5 + 1;
      if (iVar8 < piVar1[lVar5 + 1]) {
        pdVar3 = (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (-1 < local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[piVar2[lVar7]]) {
            piVar2[iVar10] =
                 local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[piVar2[lVar7]];
            pdVar3[iVar10] = pdVar3[lVar7];
            iVar10 = iVar10 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < piVar1[lVar6]);
      }
      iVar8 = this->num_col_;
      lVar5 = lVar6;
    } while (lVar6 < iVar8);
  }
  (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[iVar8] = iVar10;
  std::vector<int,_std::allocator<int>_>::resize(&this->start_,(long)this->num_col_ + 1);
  std::vector<int,_std::allocator<int>_>::resize(&this->index_,(long)iVar10);
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar10);
  this->num_row_ = iVar9;
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HighsSparseMatrix::deleteRows(
    const HighsIndexCollection& index_collection) {
  assert(this->formatOk());
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return;

  HighsInt delete_from_row;
  HighsInt delete_to_row;
  HighsInt keep_from_row;
  HighsInt row_dim = this->num_row_;
  HighsInt keep_to_row = -1;
  HighsInt current_set_entry = 0;

  // Set up a row mask to indicate the new row index of kept rows and
  // -1 for deleted rows so that the kept entries in the column-wise
  // matrix can be identified and have their correct row index.
  vector<HighsInt> new_index;
  new_index.resize(this->num_row_);
  HighsInt new_num_row = 0;
  bool mask = index_collection.is_mask_;
  const vector<HighsInt>& row_mask = index_collection.mask_;
  if (!mask) {
    keep_to_row = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, delete_from_row, delete_to_row,
                       keep_from_row, keep_to_row, current_set_entry);
      if (k == from_k) {
        // Account for any initial rows being kept
        for (HighsInt row = 0; row < delete_from_row; row++) {
          new_index[row] = new_num_row;
          new_num_row++;
        }
      }
      for (HighsInt row = delete_from_row; row <= delete_to_row; row++) {
        new_index[row] = -1;
      }
      for (HighsInt row = keep_from_row; row <= keep_to_row; row++) {
        new_index[row] = new_num_row;
        new_num_row++;
      }
      if (keep_to_row >= row_dim - 1) break;
    }
  } else {
    for (HighsInt row = 0; row < this->num_row_; row++) {
      if (row_mask[row]) {
        new_index[row] = -1;
      } else {
        new_index[row] = new_num_row;
        new_num_row++;
      }
    }
  }
  HighsInt new_num_nz = 0;
  for (HighsInt col = 0; col < this->num_col_; col++) {
    HighsInt from_el = this->start_[col];
    this->start_[col] = new_num_nz;
    for (HighsInt el = from_el; el < this->start_[col + 1]; el++) {
      HighsInt row = this->index_[el];
      HighsInt new_row = new_index[row];
      if (new_row >= 0) {
        this->index_[new_num_nz] = new_row;
        this->value_[new_num_nz] = this->value_[el];
        new_num_nz++;
      }
    }
  }
  this->start_[this->num_col_] = new_num_nz;
  this->start_.resize(this->num_col_ + 1);
  this->index_.resize(new_num_nz);
  this->value_.resize(new_num_nz);
  // Update the number of rows
  this->num_row_ = new_num_row;
}